

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O2

int cmd_searchpath(char *arg)

{
  char cVar1;
  FILE *__stream;
  int iVar2;
  char *__s1;
  long *plVar3;
  int *piVar4;
  char *__format;
  undefined1 local_b8 [8];
  stat st;
  
  __s1 = strchr(arg,0x20);
  do {
    if (__s1 == (char *)0x0) {
LAB_001090b3:
      plVar3 = (long *)ly_ctx_get_searchdirs(ctx);
      if (plVar3 != (long *)0x0) {
        for (; *plVar3 != 0; plVar3 = plVar3 + 1) {
          fprintf(_stdout,"%s\n");
        }
      }
      return 0;
    }
    cVar1 = *__s1;
    if (cVar1 != ' ') {
      if (cVar1 != '\0') {
        if ((((cVar1 != '-') || (__s1[1] != 'h')) || ((__s1[2] & 0xdfU) != 0)) &&
           ((iVar2 = strncmp(__s1,"--help",6), iVar2 != 0 || ((__s1[6] & 0xdfU) != 0)))) {
          iVar2 = strncmp(__s1,"--clear",7);
          if ((iVar2 == 0) && ((__s1[7] & 0xdfU) == 0)) {
            ly_ctx_unset_searchdirs(ctx,0xffffffffffffffff);
            return 0;
          }
          iVar2 = stat(__s1,(stat *)local_b8);
          __stream = _stderr;
          if (iVar2 == -1) {
            piVar4 = __errno_location();
            __s1 = strerror(*piVar4);
            __format = "Failed to stat the search path (%s).\n";
          }
          else {
            if (((uint)st.st_nlink & 0xf000) == 0x4000) {
              ly_ctx_set_searchdir(ctx,__s1);
              return 0;
            }
            __format = "\"%s\" is not a directory.\n";
          }
          fprintf(__stream,__format,__s1);
          return 1;
        }
        cmd_searchpath_help();
        return 0;
      }
      goto LAB_001090b3;
    }
    __s1 = __s1 + 1;
  } while( true );
}

Assistant:

int
cmd_searchpath(const char *arg)
{
    const char *path;
    const char * const *searchpaths;
    int index;
    struct stat st;

    for (path = strchr(arg, ' '); path && (path[0] == ' '); ++path);
    if (!path || (path[0] == '\0')) {
        searchpaths = ly_ctx_get_searchdirs(ctx);
        if (searchpaths) {
            for (index = 0; searchpaths[index]; index++) {
                fprintf(stdout, "%s\n", searchpaths[index]);
            }
        }
        return 0;
    }

    if ((!strncmp(path, "-h", 2) && (path[2] == '\0' || path[2] == ' ')) ||
        (!strncmp(path, "--help", 6) && (path[6] == '\0' || path[6] == ' '))) {
        cmd_searchpath_help();
        return 0;
    } else if (!strncmp(path, "--clear", 7) && (path[7] == '\0' || path[7] == ' ')) {
        ly_ctx_unset_searchdirs(ctx, -1);
        return 0;
    }

    if (stat(path, &st) == -1) {
        fprintf(stderr, "Failed to stat the search path (%s).\n", strerror(errno));
        return 1;
    }
    if (!S_ISDIR(st.st_mode)) {
        fprintf(stderr, "\"%s\" is not a directory.\n", path);
        return 1;
    }

    ly_ctx_set_searchdir(ctx, path);

    return 0;
}